

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void google::protobuf::protobuf_google_2fprotobuf_2fdescriptor_2eproto::anon_unknown_5::
     protobuf_AssignDescriptors(void)

{
  allocator local_31;
  string local_30;
  MessageFactory *local_10;
  MessageFactory *factory;
  
  AddDescriptors();
  local_10 = (MessageFactory *)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"google/protobuf/descriptor.proto",&local_31);
  internal::AssignDescriptors
            (&local_30,(MigrationSchema *)schemas,(Message **)file_default_instances,
             (uint32 *)TableStruct::offsets,local_10,
             (Metadata *)&(anonymous_namespace)::file_level_metadata,
             (EnumDescriptor **)&(anonymous_namespace)::file_level_enum_descriptors,
             (ServiceDescriptor **)0x0);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return;
}

Assistant:

void protobuf_AssignDescriptors() {
  AddDescriptors();
  ::google::protobuf::MessageFactory* factory = NULL;
  AssignDescriptors(
      "google/protobuf/descriptor.proto", schemas, file_default_instances, TableStruct::offsets, factory,
      file_level_metadata, file_level_enum_descriptors, NULL);
}